

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

PlayerInfo * __thiscall RenX::Server::getPlayerByPartName(Server *this,string_view partName)

{
  PlayerInfo *pPVar1;
  
  if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size == 0) {
    pPVar1 = (PlayerInfo *)0x0;
  }
  else {
    pPVar1 = getPlayerByName(this,partName);
    if (pPVar1 == (PlayerInfo *)0x0) {
      pPVar1 = getPlayerByPartNameFast(this,partName);
      return pPVar1;
    }
  }
  return pPVar1;
}

Assistant:

RenX::PlayerInfo *RenX::Server::getPlayerByPartName(std::string_view partName) const {
	if (this->players.size() == 0)
		return nullptr;

	RenX::PlayerInfo *r = getPlayerByName(partName);
	if (r != nullptr)
		return r;

	return getPlayerByPartNameFast(partName);
}